

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetisWriter.cc
# Opt level: O2

void writeMetisLine(ofstream *outputfile,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *neighbors)

{
  ostream *poVar1;
  string untrimmed_neighbor_str;
  stringstream node_list_stream;
  long local_1f8;
  long local_1f0;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0 [4];
  long local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  stringstream local_198 [16];
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a8 = local_188;
  local_1a0 = " ";
  std::
  copy<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::ostream_iterator<unsigned_long,char,std::char_traits<char>>>
            ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )&local_1f8,
             (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(neighbors->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start,
             (ostream_iterator<unsigned_long,_char,_std::char_traits<char>_> *)
             (neighbors->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string((string *)&local_1f8,local_1d0[0]._M_current,(allocator *)&local_1d8)
  ;
  std::__cxx11::string::~string((string *)local_1d0);
  local_1d8.current._M_current =
       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(local_1f0 + local_1f8);
  local_1b0 = local_1f8;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1d0,&local_1d8,
             (unary_negate<std::pointer_to_unary_function<int,_int>_>)&local_1b0);
  std::__cxx11::string::erase(&local_1f8,local_1d0[0]._M_current,local_1f8 + local_1f0);
  poVar1 = std::operator<<((ostream *)outputfile,(string *)&local_1f8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void writeMetisLine(std::ofstream* outputfile,
            const std::vector<uint64_t>& neighbors) {
        std::stringstream node_list_stream;
        std::copy(neighbors.begin(),
                neighbors.end(),
                std::ostream_iterator<uint64_t>(node_list_stream, " "));
        std::string untrimmed_neighbor_str = node_list_stream.str().c_str();
        *outputfile << rtrim(&untrimmed_neighbor_str) << std::endl;
    }